

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::declareArray
          (string *__return_storage_ptr__,Variable *this,string *sizeExpr)

{
  DeclareVariable local_c0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *sizeExpr_local;
  Variable *this_local;
  
  local_20 = sizeExpr;
  sizeExpr_local = (string *)this;
  this_local = (Variable *)__return_storage_ptr__;
  glu::declare(&local_c0,&this->m_type,&this->m_name,0);
  de::toString<glu::decl::DeclareVariable>(&local_80,&local_c0);
  std::operator+(&local_60,&local_80,"[");
  std::operator+(&local_40,&local_60,local_20);
  std::operator+(__return_storage_ptr__,&local_40,"];\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  glu::decl::DeclareVariable::~DeclareVariable(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::declareArray (const string& sizeExpr) const
{
	DE_ASSERT(m_isArray);
	return de::toString(glu::declare(m_type, m_name)) + "[" + sizeExpr + "];\n";
}